

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::HttpClient::ConnectRequest::Status,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:6958:23)>
::getImpl(SimpleTransformPromiseNode<kj::HttpClient::ConnectRequest::Status,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:6958:23)>
          *this,ExceptionOrValue *output)

{
  AsyncIoStream *pAVar1;
  Disposer *pDVar2;
  PromiseArena *pPVar3;
  SourceLocation location;
  undefined1 auVar4 [8];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  String *pSVar8;
  long lVar9;
  OwnPromiseNode node;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar10;
  void *pvVar11;
  TransformPromiseNodeBase *this_00;
  StringPtr expected;
  ArrayBuilder<kj::Promise<void>_> promises;
  Fault f;
  Array<kj::Promise<void>_> result;
  OwnPromiseNode intermediate;
  ExceptionOr<kj::HttpClient::ConnectRequest::Status> depResult;
  undefined1 local_490 [8];
  undefined1 local_488 [40];
  bool local_460;
  undefined1 local_450 [24];
  String *local_438;
  long lStack_430;
  char *local_428;
  OwnPromiseNode local_420;
  char *local_418;
  char *pcStack_410;
  undefined8 local_408;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_400;
  Status local_3f8;
  ExceptionOr<kj::Promise<void>_> local_3b8;
  ExceptionOrValue local_210;
  char local_78;
  Status local_70;
  
  local_210.exception.ptr.isSet = false;
  local_78 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_210);
  if (local_210.exception.ptr.isSet == true) {
    local_3b8.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_210.exception.ptr.field_1.value.ownFile.content.ptr;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_210.exception.ptr.field_1.value.ownFile.content.size_;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_210.exception.ptr.field_1.value.ownFile.content.disposer;
    local_210.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_210.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_210.exception.ptr.field_1.value.file;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_210.exception.ptr.field_1._32_8_;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_210.exception.ptr.field_1.value.description.content.ptr;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_210.exception.ptr.field_1.value.description.content.size_;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_210.exception.ptr.field_1.value.description.content.disposer;
    local_210.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_210.exception.ptr.field_1.value.description.content.size_ = 0;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_210.exception.ptr.field_1.value.context.ptr.disposer;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         local_210.exception.ptr.field_1.value.context.ptr.ptr;
    local_210.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_210.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_210.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_210.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_210.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_210.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_3b8.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_210.exception.ptr.field_1 + 0x68),0x105);
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_210.exception.ptr.field_1.value.details.builder.ptr;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_210.exception.ptr.field_1.value.details.builder.pos;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_210.exception.ptr.field_1.value.details.builder.endPtr;
    local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_210.exception.ptr.field_1.value.details.builder.disposer;
    local_210.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_210.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_210.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_3b8.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_3b8)
    ;
    aVar10 = local_3b8.value.ptr.field_1;
    if ((local_3b8.value.ptr.isSet == true) &&
       (local_3b8.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0)) {
      local_3b8.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar10);
    }
  }
  else {
    if (local_78 != '\x01') goto LAB_0035142f;
    local_488._0_8_ = &local_3f8;
    local_3f8.statusCode = local_70.statusCode;
    local_3f8.statusText.content.ptr = local_70.statusText.content.ptr;
    local_3f8.statusText.content.size_ = local_70.statusText.content.size_;
    local_3f8.statusText.content.disposer = local_70.statusText.content.disposer;
    local_70.statusText.content.ptr = (char *)0x0;
    local_70.statusText.content.size_ = 0;
    local_3f8.headers.disposer = local_70.headers.disposer;
    local_3f8.headers.ptr = local_70.headers.ptr;
    local_70.headers.ptr = (HttpHeaders *)0x0;
    local_3f8.errorBody.ptr.disposer = local_70.errorBody.ptr.disposer;
    local_3f8.errorBody.ptr.ptr = local_70.errorBody.ptr.ptr;
    local_70.errorBody.ptr.ptr = (AsyncInputStream *)0x0;
    local_488._8_4_ = 200;
    local_488._16_8_ = " == ";
    local_488._24_8_ = &DAT_00000005;
    local_488[0x20] = local_70.statusCode == 200;
    if (!(bool)local_488[0x20]) {
      Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
                ((Fault *)local_450,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x1b2f,FAILED,"status.statusCode == 200","_kjCondition,",
                 (DebugComparison<unsigned_int_&,_int> *)local_488);
      Debug::Fault::fatal((Fault *)local_450);
    }
    local_438 = &local_3f8.statusText;
    local_450._0_8_ = "OK";
    local_450._8_8_ = (char *)0x3;
    DebugExpression<kj::String&>::operator==
              ((DebugComparison<kj::String_&,_kj::StringPtr> *)local_488,
               (DebugExpression<kj::String&> *)&local_438,(StringPtr *)local_450);
    if (local_460 == false) {
      Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<kj::String&,kj::StringPtr>&>
                ((Fault *)local_450,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x1b30,FAILED,"status.statusText == \"OK\"_kj","_kjCondition,",
                 (DebugComparison<kj::String_&,_kj::StringPtr> *)local_488);
      Debug::Fault::fatal((Fault *)local_450);
    }
    local_488._0_8_ =
         HeapArrayDisposer::allocateImpl
                   (8,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_488._16_8_ = &(((String *)local_488._0_8_)->content).disposer;
    local_488._24_8_ = &HeapArrayDisposer::instance;
    pAVar1 = (this->func).io.ptr;
    local_488._8_8_ = local_488._0_8_;
    (**(pAVar1->super_AsyncOutputStream)._vptr_AsyncOutputStream)
              (local_450,&pAVar1->super_AsyncOutputStream,"hello",5);
    ((Array<char> *)local_488._8_8_)->ptr = (char *)local_450._0_8_;
    local_488._8_8_ = &((Array<char> *)local_488._8_8_)->size_;
    expected.content.size_ = (size_t)"hello";
    expected.content.ptr = (char *)(this->func).io.ptr;
    kj::anon_unknown_0::expectRead((AsyncInputStream *)local_450,expected);
    *(undefined8 *)local_488._8_8_ = local_450._0_8_;
    lStack_430 = local_488._8_8_ + (8 - local_488._0_8_) >> 3;
    local_438 = (String *)local_488._0_8_;
    local_428 = (char *)local_488._24_8_;
    local_488._0_8_ = (String *)0x0;
    local_488._8_8_ = (ArrayDisposer *)0x0;
    local_488._16_8_ = (char *)0x0;
    local_418 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
    ;
    pcStack_410 = "operator()";
    local_408 = 0xc00001b35;
    location.function = "operator()";
    location.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
    ;
    location.lineNumber = 0x1b35;
    location.columnNumber = 0xc;
    joinPromises((Array<kj::Promise<void>_> *)local_490,location);
    auVar4 = local_490;
    pDVar2 = (this->func).io.disposer;
    pAVar1 = (this->func).io.ptr;
    (this->func).io.ptr = (AsyncIoStream *)0x0;
    pPVar3 = ((PromiseArenaMember *)local_490)->arena;
    if (pPVar3 == (PromiseArena *)0x0 || (ulong)((long)local_490 - (long)pPVar3) < 0x30) {
      pvVar11 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar11 + 0x3d0);
      TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_490,
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:6966:15)>
                 ::anon_class_16_1_3fcf65e4_for_func::operator());
      *(undefined ***)((long)pvVar11 + 0x3d0) = &PTR_destroy_0063bf88;
      *(Disposer **)((long)pvVar11 + 0x3f0) = pDVar2;
      *(AsyncIoStream **)((long)pvVar11 + 0x3f8) = pAVar1;
      *(void **)((long)pvVar11 + 0x3d8) = pvVar11;
    }
    else {
      ((PromiseArenaMember *)local_490)->arena = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)((long)local_490 + -0x30);
      TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_490,
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:6966:15)>
                 ::anon_class_16_1_3fcf65e4_for_func::operator());
      ((PromiseArenaMember *)((long)auVar4 + -0x30))->_vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_0063bf88;
      ((PromiseArenaMember *)((long)auVar4 + -0x10))->_vptr_PromiseArenaMember =
           (_func_int **)pDVar2;
      ((PromiseArenaMember *)((long)auVar4 + -0x10))->arena = (PromiseArena *)pAVar1;
      ((PromiseArenaMember *)((long)auVar4 + -0x30))->arena = pPVar3;
    }
    local_450._0_8_ = &DAT_004a8171;
    local_450._8_8_ = &DAT_004a81d0;
    local_450._16_8_ = &DAT_4c0000058b;
    local_420.ptr = &this_00->super_PromiseNode;
    PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_400.value,&local_420,(SourceLocation *)local_450);
    node.ptr = local_420.ptr;
    if ((TransformPromiseNodeBase *)local_420.ptr != (TransformPromiseNodeBase *)0x0) {
      local_420.ptr = (PromiseNode *)0x0;
      PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
    }
    auVar4 = local_490;
    if (local_490 != (undefined1  [8])0x0) {
      local_490 = (undefined1  [8])0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)auVar4);
    }
    lVar9 = lStack_430;
    pSVar8 = local_438;
    if (local_438 != (String *)0x0) {
      local_438 = (String *)0x0;
      lStack_430 = 0;
      (*(code *)**(undefined8 **)local_428)
                (local_428,pSVar8,8,lVar9,lVar9,
                 ArrayDisposer::Dispose_<kj::Promise<void>_>::destruct);
    }
    uVar7 = local_488._16_8_;
    uVar6 = local_488._8_8_;
    uVar5 = local_488._0_8_;
    if ((String *)local_488._0_8_ != (String *)0x0) {
      local_488._0_8_ = (String *)0x0;
      local_488._8_8_ = (ArrayDisposer *)0x0;
      local_488._16_8_ = (char *)0x0;
      (*(code *)**(undefined8 **)local_488._24_8_)
                (local_488._24_8_,uVar5,8,(long)(uVar6 - uVar5) >> 3,(long)(uVar7 - uVar5) >> 3,
                 ArrayDisposer::Dispose_<kj::Promise<void>_>::destruct);
    }
    HttpClient::ConnectRequest::Status::~Status(&local_3f8);
    local_3b8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_3b8.value.ptr.isSet = true;
    local_3b8.value.ptr.field_1 = local_400;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_3b8)
    ;
    aVar10 = local_3b8.value.ptr.field_1;
    if ((local_3b8.value.ptr.isSet == true) &&
       (local_3b8.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0)) {
      local_3b8.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar10);
    }
  }
  if (local_3b8.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_3b8.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_0035142f:
  if (local_78 == '\x01') {
    HttpClient::ConnectRequest::Status::~Status(&local_70);
  }
  if (local_210.exception.ptr.isSet == true) {
    Exception::~Exception(&local_210.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }